

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

CreatedTransactionResult *
wallet::FundTransaction
          (CreatedTransactionResult *__return_storage_ptr__,CWallet *wallet,CMutableTransaction *tx,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *recipients,
          UniValue *options,CCoinControl *coinControl,bool override_min_fee)

{
  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_> *this;
  pointer pUVar1;
  Descriptor *pDVar2;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  optional<OutputType> oVar8;
  _Storage<CFeeRate,_true> _Var9;
  CCoinControl *pCVar10;
  UniValue *pUVar11;
  UniValue *pUVar12;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar13;
  string *psVar14;
  long lVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  T *pTVar19;
  allocator_type *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  iterator __begin4;
  pointer puVar20;
  pointer pUVar21;
  long lVar22;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
  __l;
  string_view hex_str;
  string_view key;
  string_view key_00;
  string_view strKey;
  string_view str;
  ulong local_8a8;
  ulong local_8a0;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  allocator_type local_842;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_841;
  UniValueType local_840;
  UniValueType local_838;
  UniValueType local_830;
  UniValueType local_828;
  UniValueType local_820;
  UniValueType local_818;
  UniValueType local_810;
  UniValueType local_808;
  UniValueType local_800;
  UniValueType local_7f8;
  UniValueType local_7f0;
  UniValueType local_7e8;
  UniValueType local_7e0;
  UniValueType local_7d8;
  UniValueType local_7d0;
  UniValueType local_7c8;
  UniValueType local_7c0;
  UniValueType local_7b8;
  UniValueType local_7b0;
  CCoinControl local_7a8;
  CPubKey pubkey;
  string change_address_str;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  CScript wit_script;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  Result<wallet::CreatedTransactionResult> txr;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_388;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_360;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_338;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_310;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_2e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_2c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_248;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._M_first.
  _M_storage._M_storage[0] =
       (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_finish;
  inline_check_non_fatal<bool>
            ((bool *)&txr,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/spend.cpp"
             ,0x1f8,"FundTransaction","tx.vout.empty()");
  CWallet::BlockUntilSyncedToCurrentChain(wallet);
  if (options->typ == VNULL) {
    bVar4 = ParseIncludeWatchonly(&NullUniValue,wallet);
LAB_00500d89:
    coinControl->fAllowWatchOnly = bVar4;
    local_8a0 = 0;
    local_8a8 = 0;
    bVar4 = false;
    pCVar10 = coinControl;
  }
  else {
    if (options->typ == VBOOL) {
      bVar4 = UniValue::get_bool(options);
      goto LAB_00500d89;
    }
    pubkey.vch._0_4_ = pubkey.vch._0_4_ & 0xffffff00;
    pubkey.vch[4] = '\x05';
    pubkey.vch[5] = '\0';
    pubkey.vch[6] = '\0';
    pubkey.vch[7] = '\0';
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[11],_UniValueType,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                *)&txr,(char (*) [11])"add_inputs",(UniValueType *)&pubkey);
    local_498._M_dataplus._M_p._0_1_ = 0;
    local_498._M_dataplus._M_p._4_4_ = 5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[15],_UniValueType,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                *)(txr.m_variant.
                   super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   _M_u._M_first._M_storage._M_storage + 0x28),(char (*) [15])"include_unsafe",
               (UniValueType *)&local_498);
    local_4b8._M_dataplus._M_p._0_1_ = 0;
    local_4b8._M_dataplus._M_p._4_4_ = 5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[14],_UniValueType,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                *)((long)&txr.m_variant.
                          super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>
                          ._M_u + 0x50),(char (*) [14])"add_to_wallet",(UniValueType *)&local_4b8);
    local_4d8._M_dataplus._M_p._0_1_ = 0;
    local_4d8._M_dataplus._M_p._4_4_ = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[14],_UniValueType,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                *)((long)&txr.m_variant.
                          super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>
                          ._M_u + 0x78),(char (*) [14])0x70ea7b,(UniValueType *)&local_4d8);
    local_4f8._M_dataplus._M_p._0_1_ = 0;
    local_4f8._M_dataplus._M_p._4_4_ = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[15],_UniValueType,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                *)&txr.m_variant.
                   super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   _M_index,(char (*) [15])"change_address",(UniValueType *)&local_4f8);
    wit_script.super_CScriptBase._union._0_4_ =
         wit_script.super_CScriptBase._union._0_4_ & 0xffffff00;
    wit_script.super_CScriptBase._union._4_4_ = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[15],_UniValueType,_true>
              (&local_3b0,(char (*) [15])0x70eaa8,(UniValueType *)&wit_script);
    scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         (uint)scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
               super__Vector_impl_data._M_start & 0xffffff00;
    scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(4,(uint)scripts_temp.
                                   super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                                   super__Vector_impl_data._M_start);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[16],_UniValueType,_true>
              (&local_388,(char (*) [16])"change_position",(UniValueType *)&scripts_temp);
    descs.
    super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ =
         (uint)descs.
               super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start & 0xffffff00;
    descs.
    super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[12],_UniValueType,_true>
              (&local_360,(char (*) [12])"change_type",(UniValueType *)&descs);
    local_7b0.typeAny = false;
    local_7b0.type = VBOOL;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[16],_UniValueType,_true>(&local_338,(char (*) [16])0x70ead7,&local_7b0);
    local_7b8.typeAny = false;
    local_7b8.type = VBOOL;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[17],_UniValueType,_true>
              (&local_310,(char (*) [17])"include_watching",&local_7b8);
    local_7c0.typeAny = false;
    local_7c0.type = VARR;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[7],_UniValueType,_true>(&local_2e8,(char (*) [7])0x6d17f5,&local_7c0);
    local_7c8.typeAny = false;
    local_7c8.type = VBOOL;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[13],_UniValueType,_true>(&local_2c0,(char (*) [13])0x70eb04,&local_7c8);
    local_7d0.typeAny = false;
    local_7d0.type = VBOOL;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[14],_UniValueType,_true>
              (&local_298,(char (*) [14])"lock_unspents",&local_7d0);
    local_7d8.typeAny = false;
    local_7d8.type = VNUM;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[9],_UniValueType,_true>(&local_270,(char (*) [9])0x74c8a3,&local_7d8);
    local_7e0.typeAny = true;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[9],_UniValueType,_true>(&local_248,(char (*) [9])0x70da43,&local_7e0);
    local_7e8.typeAny = true;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[8],_UniValueType,_true>(&local_220,(char (*) [8])0x70b17f,&local_7e8);
    local_7f0.typeAny = false;
    local_7f0.type = VBOOL;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[5],_UniValueType,_true>(&local_1f8,(char (*) [5])0x70d55e,&local_7f0);
    local_7f8.typeAny = false;
    local_7f8.type = VOBJ;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[13],_UniValueType,_true>
              (&local_1d0,(char (*) [13])"solving_data",&local_7f8);
    local_800.typeAny = false;
    local_800.type = VARR;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[23],_UniValueType,_true>(&local_1a8,(char (*) [23])0x70eb3a,&local_800);
    local_808.typeAny = false;
    local_808.type = VARR;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[26],_UniValueType,_true>
              (&local_180,(char (*) [26])"subtract_fee_from_outputs",&local_808);
    local_810.typeAny = false;
    local_810.type = VBOOL;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[12],_UniValueType,_true>(&local_158,(char (*) [12])0x70091a,&local_810);
    local_818.typeAny = false;
    local_818.type = VNUM;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[12],_UniValueType,_true>
              (&local_130,(char (*) [12])"conf_target",&local_818);
    local_820.typeAny = false;
    local_820.type = VSTR;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[14],_UniValueType,_true>(&local_108,(char (*) [14])0x70ea28,&local_820);
    local_828.typeAny = false;
    local_828.type = VNUM;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[8],_UniValueType,_true>(&local_e0,(char (*) [8])0x70b190,&local_828);
    local_830.typeAny = false;
    local_830.type = VNUM;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[8],_UniValueType,_true>(&local_b8,(char (*) [8])"maxconf",&local_830);
    local_838.typeAny = false;
    local_838.type = VARR;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[14],_UniValueType,_true>
              (&local_90,(char (*) [14])"input_weights",&local_838);
    local_840.typeAny = false;
    local_840.type = VNUM;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
    ::pair<const_char_(&)[14],_UniValueType,_true>
              (&local_68,(char (*) [14])"max_tx_weight",&local_840);
    __a = &local_842;
    __l._M_len = 0x1b;
    __l._M_array = (iterator)&txr;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
           *)&change_address_str,__l,&local_841,__a);
    pCVar10 = (CCoinControl *)&DAT_00000001;
    RPCTypeCheckObj(options,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                             *)&change_address_str,true,true);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                 *)&change_address_str);
    lVar15 = 0x410;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&txr.m_variant.
                         super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>
                         ._M_u + lVar15));
      lVar15 = lVar15 + -0x28;
    } while (lVar15 != -0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&txr,"add_inputs",(allocator<char> *)&change_address_str);
    bVar4 = UniValue::exists(options,(string *)&txr);
    std::__cxx11::string::~string((string *)&txr);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txr,"add_inputs",(allocator<char> *)&change_address_str);
      pUVar12 = UniValue::operator[](options,(string *)&txr);
      bVar4 = UniValue::get_bool(pUVar12);
      coinControl->m_allow_other_inputs = bVar4;
      pCVar10 = coinControl;
      std::__cxx11::string::~string((string *)&txr);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&txr,"changeAddress",(allocator<char> *)&pubkey);
    bVar4 = UniValue::exists(options,(string *)&txr);
    if (bVar4) {
      std::__cxx11::string::~string((string *)&txr);
LAB_00501385:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txr,"change_address",(allocator<char> *)&pubkey);
      bVar4 = UniValue::exists(options,(string *)&txr);
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_498,"change_address",(allocator<char> *)&local_7b0);
        pUVar12 = UniValue::operator[](options,&local_498);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_498,"changeAddress",(allocator<char> *)&local_7b0);
        pUVar12 = UniValue::operator[](options,&local_498);
      }
      psVar14 = UniValue::get_str_abi_cxx11_(pUVar12);
      std::__cxx11::string::string((string *)&change_address_str,psVar14);
      std::__cxx11::string::~string((string *)&local_498);
      std::__cxx11::string::~string((string *)&txr);
      DecodeDestination((CTxDestination *)&txr,&change_address_str);
      bVar4 = IsValidDestination((CTxDestination *)&txr);
      if (!bVar4) {
        pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pubkey,"Change address must be a valid bitcoin address",
                   (allocator<char> *)&local_4b8);
        JSONRPCError(pUVar12,-5,(string *)&pubkey);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00503997;
      }
      std::__detail::__variant::
      _Copy_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::operator=((_Copy_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   *)coinControl,
                  (_Copy_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   *)&txr);
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&txr);
      std::__cxx11::string::~string((string *)&change_address_str);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&change_address_str,"change_address",(allocator<char> *)&local_498);
      bVar4 = UniValue::exists(options,&change_address_str);
      std::__cxx11::string::~string((string *)&change_address_str);
      std::__cxx11::string::~string((string *)&txr);
      if (bVar4) goto LAB_00501385;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&txr,"changePosition",(allocator<char> *)&pubkey);
    bVar4 = UniValue::exists(options,(string *)&txr);
    if (bVar4) {
      std::__cxx11::string::~string((string *)&txr);
LAB_0050153e:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txr,"change_position",(allocator<char> *)&change_address_str);
      bVar4 = UniValue::exists(options,(string *)&txr);
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b8,"change_position",(allocator<char> *)&local_7b8);
        pUVar12 = UniValue::operator[](options,&local_4b8);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b8,"changePosition",(allocator<char> *)&local_7b8);
        pUVar12 = UniValue::operator[](options,&local_4b8);
      }
      uVar7 = UniValue::getInt<int>(pUVar12);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&txr);
      if (-1 < (int)uVar7) {
        local_8a0 = (ulong)uVar7;
        pCVar10 = (CCoinControl *)0x60;
        local_8a8 = 0x100000000;
        if (local_8a0 <=
            (ulong)(((long)(recipients->
                           super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(recipients->
                          super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x60)) goto LAB_005016a6;
      }
      pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txr,"changePosition out of bounds",
                 (allocator<char> *)&change_address_str);
      JSONRPCError(pUVar12,-8,(string *)&txr);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00503997;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&change_address_str,"change_position",(allocator<char> *)&local_4b8);
    bVar4 = UniValue::exists(options,&change_address_str);
    std::__cxx11::string::~string((string *)&change_address_str);
    std::__cxx11::string::~string((string *)&txr);
    if (bVar4) goto LAB_0050153e;
    local_8a0 = 0;
    local_8a8 = 0;
LAB_005016a6:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&txr,"change_type",(allocator<char> *)&change_address_str);
    bVar4 = UniValue::exists(options,(string *)&txr);
    std::__cxx11::string::~string((string *)&txr);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txr,"changeAddress",(allocator<char> *)&pubkey);
      bVar4 = UniValue::exists(options,(string *)&txr);
      if (bVar4) {
        std::__cxx11::string::~string((string *)&txr);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&change_address_str,"change_address",(allocator<char> *)&local_4d8);
        bVar4 = UniValue::exists(options,&change_address_str);
        std::__cxx11::string::~string((string *)&change_address_str);
        std::__cxx11::string::~string((string *)&txr);
        if (!bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&txr,"change_type",(allocator<char> *)&change_address_str);
          pUVar12 = UniValue::operator[](options,(string *)&txr);
          psVar14 = UniValue::get_str_abi_cxx11_(pUVar12);
          oVar8 = ParseOutputType(psVar14);
          std::__cxx11::string::~string((string *)&txr);
          if (((ulong)oVar8.super__Optional_base<OutputType,_true,_true>._M_payload.
                      super__Optional_payload_base<OutputType> & 0x100000000) == 0) {
            pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&change_address_str,"change_type",(allocator<char> *)&pubkey);
            pUVar11 = UniValue::operator[](options,&change_address_str);
            psVar14 = UniValue::get_str_abi_cxx11_(pUVar11);
            tinyformat::format<std::__cxx11::string>
                      ((string *)&txr,(tinyformat *)"Unknown change type \'%s\'",(char *)psVar14,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar10)
            ;
            JSONRPCError(pUVar12,-5,(string *)&txr);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00503997;
          }
          (coinControl->m_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
          super__Optional_payload_base<OutputType>._M_payload._M_value =
               oVar8.super__Optional_base<OutputType,_true,_true>._M_payload.
               super__Optional_payload_base<OutputType>._M_payload;
          (coinControl->m_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
          super__Optional_payload_base<OutputType>._M_engaged = true;
          goto LAB_005017d6;
        }
      }
      pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txr,"Cannot specify both change address and address type options",
                 (allocator<char> *)&change_address_str);
      JSONRPCError(pUVar12,-8,(string *)&txr);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00503997;
    }
LAB_005017d6:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&change_address_str,"include_watching",(allocator<char> *)&pubkey);
    bVar4 = UniValue::exists(options,&change_address_str);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,"include_watching",(allocator<char> *)&local_7c0);
      pUVar12 = UniValue::operator[](options,&local_4d8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,"includeWatching",(allocator<char> *)&local_7c0);
      pUVar12 = UniValue::operator[](options,&local_4d8);
    }
    UniValue::UniValue((UniValue *)&txr,pUVar12);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&change_address_str);
    bVar4 = ParseIncludeWatchonly((UniValue *)&txr,wallet);
    coinControl->fAllowWatchOnly = bVar4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&change_address_str,"lockUnspents",(allocator<char> *)&local_4f8);
    bVar4 = UniValue::exists(options,&change_address_str);
    if (bVar4) {
      std::__cxx11::string::~string((string *)&change_address_str);
LAB_00501941:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&change_address_str,"lock_unspents",(allocator<char> *)&pubkey);
      bVar4 = UniValue::exists(options,&change_address_str);
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f8,"lock_unspents",(allocator<char> *)&local_7c8);
        pUVar12 = UniValue::operator[](options,&local_4f8);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f8,"lockUnspents",(allocator<char> *)&local_7c8);
        pUVar12 = UniValue::operator[](options,&local_4f8);
      }
      bVar4 = UniValue::get_bool(pUVar12);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&change_address_str);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pubkey,"lock_unspents",(allocator<char> *)&wit_script);
      bVar4 = UniValue::exists(options,(string *)&pubkey);
      std::__cxx11::string::~string((string *)&pubkey);
      std::__cxx11::string::~string((string *)&change_address_str);
      if (bVar4) goto LAB_00501941;
      bVar4 = false;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&change_address_str,"include_unsafe",(allocator<char> *)&pubkey);
    bVar5 = UniValue::exists(options,&change_address_str);
    std::__cxx11::string::~string((string *)&change_address_str);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&change_address_str,"include_unsafe",(allocator<char> *)&pubkey);
      pUVar12 = UniValue::operator[](options,&change_address_str);
      bVar5 = UniValue::get_bool(pUVar12);
      coinControl->m_include_unsafe_inputs = bVar5;
      std::__cxx11::string::~string((string *)&change_address_str);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&change_address_str,"feeRate",(allocator<char> *)&pubkey);
    bVar5 = UniValue::exists(options,&change_address_str);
    std::__cxx11::string::~string((string *)&change_address_str);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&change_address_str,"fee_rate",(allocator<char> *)&pubkey);
      bVar5 = UniValue::exists(options,&change_address_str);
      std::__cxx11::string::~string((string *)&change_address_str);
      if (bVar5) {
        pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scripts_temp,"Cannot specify both fee_rate (",&::CURRENCY_ATOM_abi_cxx11_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &wit_script,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scripts_temp,"/vB) and feeRate (");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pubkey,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &wit_script,&::CURRENCY_UNIT_abi_cxx11_);
        std::operator+(&change_address_str,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pubkey,
                       "/kvB)");
        JSONRPCError(pUVar12,-8,&change_address_str);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00503997;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&change_address_str,"conf_target",(allocator<char> *)&pubkey);
      bVar5 = UniValue::exists(options,&change_address_str);
      std::__cxx11::string::~string((string *)&change_address_str);
      if (bVar5) {
        pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&change_address_str,
                   "Cannot specify both conf_target and feeRate. Please provide either a confirmation target in blocks for automatic fee estimation, or an explicit fee rate."
                   ,(allocator<char> *)&pubkey);
        JSONRPCError(pUVar12,-8,&change_address_str);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00503997;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&change_address_str,"estimate_mode",(allocator<char> *)&pubkey);
      bVar5 = UniValue::exists(options,&change_address_str);
      std::__cxx11::string::~string((string *)&change_address_str);
      if (bVar5) {
        pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&change_address_str,"Cannot specify both estimate_mode and feeRate",
                   (allocator<char> *)&pubkey);
        JSONRPCError(pUVar12,-8,&change_address_str);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00503997;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&change_address_str,"feeRate",(allocator<char> *)&pubkey);
      pUVar12 = UniValue::operator[](options,&change_address_str);
      _Var9 = (_Storage<CFeeRate,_true>)AmountFromValue(pUVar12,8);
      if ((coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
          super__Optional_payload_base<CFeeRate>._M_engaged == false) {
        (coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
        super__Optional_payload_base<CFeeRate>._M_engaged = true;
      }
      (coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_payload = _Var9;
      std::__cxx11::string::~string((string *)&change_address_str);
      coinControl->fOverrideFeeRate = true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&change_address_str,"replaceable",(allocator<char> *)&pubkey);
    bVar5 = UniValue::exists(options,&change_address_str);
    std::__cxx11::string::~string((string *)&change_address_str);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&change_address_str,"replaceable",(allocator<char> *)&pubkey);
      pUVar12 = UniValue::operator[](options,&change_address_str);
      bVar5 = UniValue::get_bool(pUVar12);
      (coinControl->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)(bVar5 | 0x100);
      std::__cxx11::string::~string((string *)&change_address_str);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&change_address_str,"minconf",(allocator<char> *)&pubkey);
    bVar5 = UniValue::exists(options,&change_address_str);
    std::__cxx11::string::~string((string *)&change_address_str);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&change_address_str,"minconf",(allocator<char> *)&pubkey);
      pUVar12 = UniValue::operator[](options,&change_address_str);
      iVar6 = UniValue::getInt<int>(pUVar12);
      coinControl->m_min_depth = iVar6;
      std::__cxx11::string::~string((string *)&change_address_str);
      if (coinControl->m_min_depth < 0) {
        pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&change_address_str,"Negative minconf",(allocator<char> *)&pubkey);
        JSONRPCError(pUVar12,-8,&change_address_str);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00503997;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&change_address_str,"maxconf",(allocator<char> *)&pubkey);
    bVar5 = UniValue::exists(options,&change_address_str);
    std::__cxx11::string::~string((string *)&change_address_str);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&change_address_str,"maxconf",(allocator<char> *)&pubkey);
      pUVar12 = UniValue::operator[](options,&change_address_str);
      iVar6 = UniValue::getInt<int>(pUVar12);
      coinControl->m_max_depth = iVar6;
      std::__cxx11::string::~string((string *)&change_address_str);
      if (coinControl->m_max_depth < coinControl->m_min_depth) {
        pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
        tinyformat::format<int,int>
                  (&change_address_str,(tinyformat *)"maxconf can\'t be lower than minconf: %d < %d"
                   ,(char *)&coinControl->m_max_depth,&coinControl->m_min_depth,(int *)__a);
        JSONRPCError(pUVar12,-8,&change_address_str);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00503997;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&change_address_str,"conf_target",(allocator<char> *)&scripts_temp);
    pUVar12 = UniValue::operator[](options,&change_address_str);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pubkey,"estimate_mode",(allocator<char> *)&descs);
    pCVar10 = (CCoinControl *)UniValue::operator[](options,(string *)&pubkey);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&wit_script,"fee_rate",(allocator<char> *)&local_7d0);
    pUVar11 = UniValue::operator[](options,(string *)&wit_script);
    SetFeeEstimateMode(wallet,coinControl,pUVar12,(UniValue *)pCVar10,pUVar11,override_min_fee);
    std::__cxx11::string::~string((string *)&wit_script);
    std::__cxx11::string::~string((string *)&pubkey);
    std::__cxx11::string::~string((string *)&change_address_str);
    UniValue::~UniValue((UniValue *)&txr);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&txr,"solving_data",(allocator<char> *)&change_address_str);
  bVar5 = UniValue::exists(options,(string *)&txr);
  std::__cxx11::string::~string((string *)&txr);
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&txr,"solving_data",(allocator<char> *)&pubkey);
    pUVar12 = UniValue::operator[](options,(string *)&txr);
    pUVar12 = UniValue::get_obj(pUVar12);
    UniValue::UniValue((UniValue *)&change_address_str,pUVar12);
    std::__cxx11::string::~string((string *)&txr);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&txr,"pubkeys",(allocator<char> *)&pubkey);
    bVar5 = UniValue::exists((UniValue *)&change_address_str,(string *)&txr);
    std::__cxx11::string::~string((string *)&txr);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txr,"pubkeys",(allocator<char> *)&pubkey);
      pUVar12 = UniValue::operator[]((UniValue *)&change_address_str,(string *)&txr);
      pUVar12 = UniValue::get_array(pUVar12);
      pvVar13 = UniValue::getValues(pUVar12);
      std::__cxx11::string::~string((string *)&txr);
      pUVar1 = (pvVar13->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      this = &(coinControl->m_external_provider).pubkeys;
      pCVar10 = (CCoinControl *)this;
      for (pUVar21 = (pvVar13->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                     super__Vector_impl_data._M_start; pUVar21 != pUVar1; pUVar21 = pUVar21 + 1) {
        psVar14 = UniValue::get_str_abi_cxx11_(pUVar21);
        HexToPubKey(&pubkey,psVar14);
        CPubKey::GetID((CKeyID *)&txr,&pubkey);
        std::
        _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
        ::_M_emplace_unique<CKeyID,CPubKey_const&>
                  ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                    *)this,(CKeyID *)&txr,&pubkey);
        WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&scripts_temp,&pubkey);
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._16_4_ =
             scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._0_4_;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._0_8_ =
             scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
             super__Vector_impl_data._M_start;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._8_8_ =
             scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
             super__Vector_impl_data._M_finish;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._72_1_ =
             5;
        GetScriptForDestination((CScript *)&wit_script.super_CScriptBase,(CTxDestination *)&txr);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&txr);
        CScriptID::CScriptID((CScriptID *)&txr,(CScript *)&wit_script.super_CScriptBase);
        std::
        _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
        ::_M_emplace_unique<CScriptID,CScript_const&>
                  ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                    *)&(coinControl->m_external_provider).scripts,(CScriptID *)&txr,
                   (CScript *)&wit_script.super_CScriptBase);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&wit_script.super_CScriptBase);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&txr,"scripts",(allocator<char> *)&pubkey);
    bVar5 = UniValue::exists((UniValue *)&change_address_str,(string *)&txr);
    std::__cxx11::string::~string((string *)&txr);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txr,"scripts",(allocator<char> *)&pubkey);
      pUVar12 = UniValue::operator[]((UniValue *)&change_address_str,(string *)&txr);
      pUVar12 = UniValue::get_array(pUVar12);
      pvVar13 = UniValue::getValues(pUVar12);
      std::__cxx11::string::~string((string *)&txr);
      pUVar1 = (pvVar13->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pUVar21 = (pvVar13->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                     super__Vector_impl_data._M_start; pUVar21 != pUVar1; pUVar21 = pUVar21 + 1) {
        psVar14 = UniValue::get_str_abi_cxx11_(pUVar21);
        str._M_str = (psVar14->_M_dataplus)._M_p;
        str._M_len = psVar14->_M_string_length;
        bVar5 = IsHex(str);
        if (!bVar5) {
          pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
          tinyformat::format<std::__cxx11::string>
                    ((string *)&txr,(tinyformat *)0x732611,(char *)psVar14,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar10);
          JSONRPCError(pUVar12,-5,(string *)&txr);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00503997;
        }
        hex_str._M_str = (psVar14->_M_dataplus)._M_p;
        hex_str._M_len = psVar14->_M_string_length;
        ParseHex<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,hex_str);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txr,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )pubkey.vch._0_8_,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )pubkey.vch._8_8_);
        CScriptID::CScriptID((CScriptID *)&wit_script,(CScript *)&txr);
        std::
        _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
        ::_M_emplace_unique<CScriptID,CScript_const&>
                  ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                    *)&(coinControl->m_external_provider).scripts,(CScriptID *)&wit_script,
                   (CScript *)&txr);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txr);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&txr,"descriptors",(allocator<char> *)&pubkey);
    bVar5 = UniValue::exists((UniValue *)&change_address_str,(string *)&txr);
    std::__cxx11::string::~string((string *)&txr);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txr,"descriptors",(allocator<char> *)&pubkey);
      pUVar12 = UniValue::operator[]((UniValue *)&change_address_str,(string *)&txr);
      pUVar12 = UniValue::get_array(pUVar12);
      pvVar13 = UniValue::getValues(pUVar12);
      std::__cxx11::string::~string((string *)&txr);
      pUVar1 = (pvVar13->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pUVar21 = (pvVar13->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                     super__Vector_impl_data._M_start; pUVar21 != pUVar1; pUVar21 = pUVar21 + 1) {
        psVar14 = UniValue::get_str_abi_cxx11_(pUVar21);
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._0_8_ =
             &PTR__FlatSigningProvider_00a2aa40;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._16_8_ =
             txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
             _16_8_ & 0xffffffff00000000;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._24_8_ =
             0;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._32_8_ =
             (long)&txr.m_variant.
                    super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                    super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                    super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                    super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                    super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                    super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                    _M_u._M_rest + 0x10;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._48_8_ =
             0;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._64_8_ =
             txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
             _64_8_ & 0xffffffff00000000;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._72_8_ =
             0;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._80_8_ =
             &txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
              _M_first + 1;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._96_8_ =
             0;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._112_4_ =
             0;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._120_8_ =
             0;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._128_8_ =
             (&txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
               _M_first)[1]._M_storage._M_storage + 0x30;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._144_8_ =
             0;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index =
             '\0';
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._161_3_ = 0;
        local_3b0.first._M_string_length._0_4_ = _S_red;
        local_3b0.first.field_2._M_allocated_capacity = 0;
        local_3b0.first.field_2._8_8_ = &local_3b0.first._M_string_length;
        local_388.first._M_dataplus._M_p = (pointer)0x0;
        pubkey.vch._0_8_ = pubkey.vch + 0x10;
        pubkey.vch[8] = '\0';
        pubkey.vch[9] = '\0';
        pubkey.vch[10] = '\0';
        pubkey.vch[0xb] = '\0';
        pubkey.vch[0xc] = '\0';
        pubkey.vch[0xd] = '\0';
        pubkey.vch[0xe] = '\0';
        pubkey.vch[0xf] = '\0';
        pubkey.vch[0x10] = '\0';
        scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._40_8_ =
             txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
             _32_8_;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._88_8_ =
             txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
             _80_8_;
        txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._136_8_ =
             txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u.
             _128_8_;
        local_3b0.second = (UniValueType)local_3b0.first.field_2._8_8_;
        Parse(&descs,psVar14,(FlatSigningProvider *)&txr,(string *)&pubkey,true);
        puVar3 = descs.
                 super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar20 = (pointer)CONCAT44(descs.
                                    super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (uint)descs.
                                          super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
        if (puVar20 ==
            descs.
            super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)&wit_script,(tinyformat *)"Unable to parse descriptor \'%s\': %s",
                     (char *)psVar14,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pubkey,
                     args_1);
          JSONRPCError(pUVar12,-8,(string *)&wit_script);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00503997;
        }
        for (; puVar20 != puVar3; puVar20 = puVar20 + 1) {
          pDVar2 = (puVar20->_M_t).
                   super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
                   super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
                   super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl;
          (*pDVar2->_vptr_Descriptor[8])
                    (pDVar2,0,(FlatSigningProvider *)&txr,&scripts_temp,(FlatSigningProvider *)&txr,
                     0);
        }
        FlatSigningProvider::Merge(&coinControl->m_external_provider,(FlatSigningProvider *)&txr);
        std::
        vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ::~vector(&descs);
        std::vector<CScript,_std::allocator<CScript>_>::~vector(&scripts_temp);
        std::__cxx11::string::~string((string *)&pubkey);
        FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)&txr);
      }
    }
    UniValue::~UniValue((UniValue *)&change_address_str);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&txr,"input_weights",(allocator<char> *)&change_address_str);
  bVar5 = UniValue::exists(options,(string *)&txr);
  std::__cxx11::string::~string((string *)&txr);
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&txr,"input_weights",(allocator<char> *)&change_address_str);
    pUVar12 = UniValue::operator[](options,(string *)&txr);
    pUVar12 = UniValue::get_array(pUVar12);
    pvVar13 = UniValue::getValues(pUVar12);
    std::__cxx11::string::~string((string *)&txr);
    pUVar1 = (pvVar13->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pUVar21 = (pvVar13->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                   super__Vector_impl_data._M_start; pUVar21 != pUVar1; pUVar21 = pUVar21 + 1) {
      strKey._M_str = "txid";
      strKey._M_len = 4;
      ParseHashO((uint256 *)&change_address_str,pUVar21,strKey);
      key._M_str = "vout";
      key._M_len = 4;
      pUVar12 = UniValue::find_value(pUVar21,key);
      if (pUVar12->typ != VNUM) {
        pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txr,"Invalid parameter, missing vout key",(allocator<char> *)&pubkey);
        JSONRPCError(pUVar12,-8,(string *)&txr);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00503997;
      }
      iVar6 = UniValue::getInt<int>(pUVar12);
      if (iVar6 < 0) {
        pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txr,"Invalid parameter, vout cannot be negative",
                   (allocator<char> *)&pubkey);
        JSONRPCError(pUVar12,-8,(string *)&txr);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00503997;
      }
      key_00._M_str = "weight";
      key_00._M_len = 6;
      pUVar12 = UniValue::find_value(pUVar21,key_00);
      if (pUVar12->typ != VNUM) {
        pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txr,"Invalid parameter, missing weight key",(allocator<char> *)&pubkey
                  );
        JSONRPCError(pUVar12,-8,(string *)&txr);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00503997;
      }
      lVar15 = UniValue::getInt<long>(pUVar12);
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._16_8_ = 0;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._24_8_ = 0;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._0_8_ = 0;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._8_8_ = 0;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._32_4_ =
           0xffffffff;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._56_8_ = 0;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._64_8_ = 0;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._40_8_ = 0;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._48_8_ = 0;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._96_8_ = 0;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._80_8_ = 0;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._88_8_ = 0;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._72_4_ =
           0xffffffff;
      pubkey.vch._0_8_ = &::TX_NO_WITNESS;
      pubkey.vch._8_8_ = (CTxIn *)&txr;
      sVar16 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTxIn_const>>
                         ((ParamsWrapper<TransactionSerParams,_const_CTxIn> *)&pubkey);
      wit_script.super_CScriptBase._union.indirect_contents.indirect =
           &::TX_WITH_WITNESS.allow_witness;
      wit_script.super_CScriptBase._union._8_8_ = (CTxIn *)&txr;
      sVar17 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTxIn_const>>
                         ((ParamsWrapper<TransactionSerParams,_const_CTxIn> *)&wit_script);
      sVar18 = GetSerializeSize<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                         ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)((long)&txr.m_variant.
                                     super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>
                                     .
                                     super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>
                                     .
                                     super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>
                                     .
                                     super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>
                                     .
                                     super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>
                                     .
                                     super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>
                                     ._M_u + 0x50));
      lVar22 = sVar17 + sVar18 + sVar16 * 3;
      CTxIn::~CTxIn((CTxIn *)&txr);
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._M_first.
      _M_storage._M_storage[0] = lVar22 == 0xa5;
      inline_check_non_fatal<bool>
                ((bool *)&txr,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/spend.cpp"
                 ,0x2b7,"FundTransaction","min_input_weight == 165");
      if (lVar15 < lVar22) {
        pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txr,
                   "Invalid parameter, weight cannot be less than 165 (41 bytes (size of outpoint + sequence + empty scriptSig) * 4 (witness scaling factor)) + 1 (empty witness)"
                   ,(allocator<char> *)&pubkey);
        JSONRPCError(pUVar12,-8,(string *)&txr);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00503997;
      }
      if (400000 < lVar15) {
        pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
        tinyformat::format<int>
                  ((string *)&txr,
                   "Invalid parameter, weight cannot be greater than the maximum standard tx weight of %d"
                   ,&MAX_STANDARD_TX_WEIGHT);
        JSONRPCError(pUVar12,-8,(string *)&txr);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00503997;
      }
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._16_8_ =
           change_address_str.field_2._M_allocated_capacity;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._24_8_ =
           change_address_str.field_2._8_8_;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._0_8_ =
           change_address_str._M_dataplus._M_p;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._8_8_ =
           change_address_str._M_string_length;
      txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._32_4_ =
           iVar6;
      CCoinControl::SetInputWeight(coinControl,(COutPoint *)&txr,lVar15);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&txr,"max_tx_weight",(allocator<char> *)&change_address_str);
  bVar5 = UniValue::exists(options,(string *)&txr);
  std::__cxx11::string::~string((string *)&txr);
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&txr,"max_tx_weight",(allocator<char> *)&change_address_str);
    pUVar12 = UniValue::operator[](options,(string *)&txr);
    uVar7 = UniValue::getInt<int>(pUVar12);
    (coinControl->m_max_tx_weight).super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> = (_Optional_payload_base<int>)((ulong)uVar7 | 0x100000000);
    std::__cxx11::string::~string((string *)&txr);
  }
  if ((recipients->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (recipients->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&txr,"TX must have at least one output",
               (allocator<char> *)&change_address_str);
    JSONRPCError(pUVar12,-8,(string *)&txr);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    CCoinControl::CCoinControl(&local_7a8,coinControl);
    FundTransaction(&txr,wallet,tx,recipients,(optional<unsigned_int>)(local_8a8 | local_8a0),bVar4,
                    &local_7a8);
    CCoinControl::~CCoinControl(&local_7a8);
    if (txr.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index ==
        '\x01') {
      pTVar19 = util::Result<wallet::CreatedTransactionResult>::value(&txr);
      CreatedTransactionResult::CreatedTransactionResult(__return_storage_ptr__,pTVar19);
      _GLOBAL__N_1::std::__detail::__variant::
      _Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>::~_Variant_storage
                ((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)&txr);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
    }
    else {
      pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
      util::ErrorString<wallet::CreatedTransactionResult>((bilingual_str *)&change_address_str,&txr)
      ;
      JSONRPCError(pUVar12,-4,&change_address_str);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
LAB_00503997:
  __stack_chk_fail();
}

Assistant:

CreatedTransactionResult FundTransaction(CWallet& wallet, const CMutableTransaction& tx, const std::vector<CRecipient>& recipients, const UniValue& options, CCoinControl& coinControl, bool override_min_fee)
{
    // We want to make sure tx.vout is not used now that we are passing outputs as a vector of recipients.
    // This sets us up to remove tx completely in a future PR in favor of passing the inputs directly.
    CHECK_NONFATAL(tx.vout.empty());
    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    std::optional<unsigned int> change_position;
    bool lockUnspents = false;
    if (!options.isNull()) {
      if (options.type() == UniValue::VBOOL) {
        // backward compatibility bool only fallback
        coinControl.fAllowWatchOnly = options.get_bool();
      }
      else {
        RPCTypeCheckObj(options,
            {
                {"add_inputs", UniValueType(UniValue::VBOOL)},
                {"include_unsafe", UniValueType(UniValue::VBOOL)},
                {"add_to_wallet", UniValueType(UniValue::VBOOL)},
                {"changeAddress", UniValueType(UniValue::VSTR)},
                {"change_address", UniValueType(UniValue::VSTR)},
                {"changePosition", UniValueType(UniValue::VNUM)},
                {"change_position", UniValueType(UniValue::VNUM)},
                {"change_type", UniValueType(UniValue::VSTR)},
                {"includeWatching", UniValueType(UniValue::VBOOL)},
                {"include_watching", UniValueType(UniValue::VBOOL)},
                {"inputs", UniValueType(UniValue::VARR)},
                {"lockUnspents", UniValueType(UniValue::VBOOL)},
                {"lock_unspents", UniValueType(UniValue::VBOOL)},
                {"locktime", UniValueType(UniValue::VNUM)},
                {"fee_rate", UniValueType()}, // will be checked by AmountFromValue() in SetFeeEstimateMode()
                {"feeRate", UniValueType()}, // will be checked by AmountFromValue() below
                {"psbt", UniValueType(UniValue::VBOOL)},
                {"solving_data", UniValueType(UniValue::VOBJ)},
                {"subtractFeeFromOutputs", UniValueType(UniValue::VARR)},
                {"subtract_fee_from_outputs", UniValueType(UniValue::VARR)},
                {"replaceable", UniValueType(UniValue::VBOOL)},
                {"conf_target", UniValueType(UniValue::VNUM)},
                {"estimate_mode", UniValueType(UniValue::VSTR)},
                {"minconf", UniValueType(UniValue::VNUM)},
                {"maxconf", UniValueType(UniValue::VNUM)},
                {"input_weights", UniValueType(UniValue::VARR)},
                {"max_tx_weight", UniValueType(UniValue::VNUM)},
            },
            true, true);

        if (options.exists("add_inputs")) {
            coinControl.m_allow_other_inputs = options["add_inputs"].get_bool();
        }

        if (options.exists("changeAddress") || options.exists("change_address")) {
            const std::string change_address_str = (options.exists("change_address") ? options["change_address"] : options["changeAddress"]).get_str();
            CTxDestination dest = DecodeDestination(change_address_str);

            if (!IsValidDestination(dest)) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Change address must be a valid bitcoin address");
            }

            coinControl.destChange = dest;
        }

        if (options.exists("changePosition") || options.exists("change_position")) {
            int pos = (options.exists("change_position") ? options["change_position"] : options["changePosition"]).getInt<int>();
            if (pos < 0 || (unsigned int)pos > recipients.size()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "changePosition out of bounds");
            }
            change_position = (unsigned int)pos;
        }

        if (options.exists("change_type")) {
            if (options.exists("changeAddress") || options.exists("change_address")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both change address and address type options");
            }
            if (std::optional<OutputType> parsed = ParseOutputType(options["change_type"].get_str())) {
                coinControl.m_change_type.emplace(parsed.value());
            } else {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Unknown change type '%s'", options["change_type"].get_str()));
            }
        }

        const UniValue include_watching_option = options.exists("include_watching") ? options["include_watching"] : options["includeWatching"];
        coinControl.fAllowWatchOnly = ParseIncludeWatchonly(include_watching_option, wallet);

        if (options.exists("lockUnspents") || options.exists("lock_unspents")) {
            lockUnspents = (options.exists("lock_unspents") ? options["lock_unspents"] : options["lockUnspents"]).get_bool();
        }

        if (options.exists("include_unsafe")) {
            coinControl.m_include_unsafe_inputs = options["include_unsafe"].get_bool();
        }

        if (options.exists("feeRate")) {
            if (options.exists("fee_rate")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both fee_rate (" + CURRENCY_ATOM + "/vB) and feeRate (" + CURRENCY_UNIT + "/kvB)");
            }
            if (options.exists("conf_target")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both conf_target and feeRate. Please provide either a confirmation target in blocks for automatic fee estimation, or an explicit fee rate.");
            }
            if (options.exists("estimate_mode")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both estimate_mode and feeRate");
            }
            coinControl.m_feerate = CFeeRate(AmountFromValue(options["feeRate"]));
            coinControl.fOverrideFeeRate = true;
        }

        if (options.exists("replaceable")) {
            coinControl.m_signal_bip125_rbf = options["replaceable"].get_bool();
        }

        if (options.exists("minconf")) {
            coinControl.m_min_depth = options["minconf"].getInt<int>();

            if (coinControl.m_min_depth < 0) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Negative minconf");
            }
        }

        if (options.exists("maxconf")) {
            coinControl.m_max_depth = options["maxconf"].getInt<int>();

            if (coinControl.m_max_depth < coinControl.m_min_depth) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("maxconf can't be lower than minconf: %d < %d", coinControl.m_max_depth, coinControl.m_min_depth));
            }
        }
        SetFeeEstimateMode(wallet, coinControl, options["conf_target"], options["estimate_mode"], options["fee_rate"], override_min_fee);
      }
    } else {
        // if options is null and not a bool
        coinControl.fAllowWatchOnly = ParseIncludeWatchonly(NullUniValue, wallet);
    }

    if (options.exists("solving_data")) {
        const UniValue solving_data = options["solving_data"].get_obj();
        if (solving_data.exists("pubkeys")) {
            for (const UniValue& pk_univ : solving_data["pubkeys"].get_array().getValues()) {
                const CPubKey pubkey = HexToPubKey(pk_univ.get_str());
                coinControl.m_external_provider.pubkeys.emplace(pubkey.GetID(), pubkey);
                // Add witness script for pubkeys
                const CScript wit_script = GetScriptForDestination(WitnessV0KeyHash(pubkey));
                coinControl.m_external_provider.scripts.emplace(CScriptID(wit_script), wit_script);
            }
        }

        if (solving_data.exists("scripts")) {
            for (const UniValue& script_univ : solving_data["scripts"].get_array().getValues()) {
                const std::string& script_str = script_univ.get_str();
                if (!IsHex(script_str)) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("'%s' is not hex", script_str));
                }
                std::vector<unsigned char> script_data(ParseHex(script_str));
                const CScript script(script_data.begin(), script_data.end());
                coinControl.m_external_provider.scripts.emplace(CScriptID(script), script);
            }
        }

        if (solving_data.exists("descriptors")) {
            for (const UniValue& desc_univ : solving_data["descriptors"].get_array().getValues()) {
                const std::string& desc_str  = desc_univ.get_str();
                FlatSigningProvider desc_out;
                std::string error;
                std::vector<CScript> scripts_temp;
                auto descs = Parse(desc_str, desc_out, error, true);
                if (descs.empty()) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Unable to parse descriptor '%s': %s", desc_str, error));
                }
                for (auto& desc : descs) {
                    desc->Expand(0, desc_out, scripts_temp, desc_out);
                }
                coinControl.m_external_provider.Merge(std::move(desc_out));
            }
        }
    }

    if (options.exists("input_weights")) {
        for (const UniValue& input : options["input_weights"].get_array().getValues()) {
            Txid txid = Txid::FromUint256(ParseHashO(input, "txid"));

            const UniValue& vout_v = input.find_value("vout");
            if (!vout_v.isNum()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, missing vout key");
            }
            int vout = vout_v.getInt<int>();
            if (vout < 0) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, vout cannot be negative");
            }

            const UniValue& weight_v = input.find_value("weight");
            if (!weight_v.isNum()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, missing weight key");
            }
            int64_t weight = weight_v.getInt<int64_t>();
            const int64_t min_input_weight = GetTransactionInputWeight(CTxIn());
            CHECK_NONFATAL(min_input_weight == 165);
            if (weight < min_input_weight) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, weight cannot be less than 165 (41 bytes (size of outpoint + sequence + empty scriptSig) * 4 (witness scaling factor)) + 1 (empty witness)");
            }
            if (weight > MAX_STANDARD_TX_WEIGHT) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, weight cannot be greater than the maximum standard tx weight of %d", MAX_STANDARD_TX_WEIGHT));
            }

            coinControl.SetInputWeight(COutPoint(txid, vout), weight);
        }
    }

    if (options.exists("max_tx_weight")) {
        coinControl.m_max_tx_weight = options["max_tx_weight"].getInt<int>();
    }

    if (recipients.empty())
        throw JSONRPCError(RPC_INVALID_PARAMETER, "TX must have at least one output");

    auto txr = FundTransaction(wallet, tx, recipients, change_position, lockUnspents, coinControl);
    if (!txr) {
        throw JSONRPCError(RPC_WALLET_ERROR, ErrorString(txr).original);
    }
    return *txr;
}